

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

string * cmFileAPI::ComputeSuffixHash(string *__return_storage_ptr__,string *file)

{
  cmCryptoHash hasher;
  cmCryptoHash cStack_28;
  
  cmCryptoHash::cmCryptoHash(&cStack_28,AlgoSHA3_256);
  cmCryptoHash::HashFile(__return_storage_ptr__,&cStack_28,file);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,'\x14');
  cmCryptoHash::~cmCryptoHash(&cStack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ComputeSuffixHash(std::string const& file)
{
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_256);
  std::string hash = hasher.HashFile(file);
  hash.resize(20, '0');
  return hash;
}